

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

ssize_t __thiscall
QSocks5SocketEngine::read(QSocks5SocketEngine *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  SocketState SVar2;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  ssize_t sStack_40;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if (*(int *)(lVar1 + 0xdc) == 3) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      sVar3 = (**(code **)(*(long *)this + 0xf8))
                        (this,CONCAT44(in_register_00000034,__fd),__buf,0,0);
      return sVar3;
    }
    goto LAB_002216c6;
  }
  if (*(int *)(lVar1 + 0xdc) == 1) {
    if (*(long *)(*(long *)(lVar1 + 0x100) + 0x28) != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        sVar3 = QRingBuffer::read((char *)(*(long *)(lVar1 + 0x100) + 0x10),
                                  CONCAT44(in_register_00000034,__fd));
        return sVar3;
      }
      goto LAB_002216c6;
    }
    SVar2 = QAbstractSocket::state((QAbstractSocket *)**(undefined8 **)(lVar1 + 0xf8));
    if (SVar2 != UnconnectedState) goto LAB_00221664;
    (**(code **)(*(long *)this + 0xa8))(this);
    latin1.m_data = "Remote host closed connection";
    latin1.m_size = 0x1d;
    QString::QString((QString *)&local_30,latin1);
    QAbstractSocketEngine::setError
              ((QAbstractSocketEngine *)this,RemoteHostClosedError,(QString *)&local_30);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
    QAbstractSocketEngine::setState((QAbstractSocketEngine *)this,UnconnectedState);
    sStack_40 = -1;
  }
  else {
LAB_00221664:
    sStack_40 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return sStack_40;
  }
LAB_002216c6:
  __stack_chk_fail();
}

Assistant:

qint64 QSocks5SocketEngine::read(char *data, qint64 maxlen)
{
    Q_D(QSocks5SocketEngine);
    QSOCKS5_Q_DEBUG << "read( , maxlen = " << maxlen << ')';
    if (d->mode == QSocks5SocketEnginePrivate::ConnectMode) {
        if (d->connectData->readBuffer.isEmpty()) {
            if (d->data->controlSocket->state() == QAbstractSocket::UnconnectedState) {
                //imitate remote closed
                close();
                setError(QAbstractSocket::RemoteHostClosedError,
                         "Remote host closed connection"_L1);
                setState(QAbstractSocket::UnconnectedState);
                return -1;
            } else {
                return 0;       // nothing to be read
            }
        }
        const qint64 copy = d->connectData->readBuffer.read(data, maxlen);
        QSOCKS5_DEBUG << "read" << dump(QByteArray(data, copy));
        return copy;
#ifndef QT_NO_UDPSOCKET
    } else if (d->mode == QSocks5SocketEnginePrivate::UdpAssociateMode) {
        return readDatagram(data, maxlen);
#endif
    }
    return 0;
}